

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPI.cpp
# Opt level: O0

int __thiscall SPI::open(SPI *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *pcVar2;
  invalid_argument *this_00;
  int *piVar3;
  error_code *peVar4;
  int in_ECX;
  error_code local_a8;
  error_code local_98;
  error_code local_88;
  error_code local_78;
  char local_68 [8];
  char spiDev [32];
  error_code local_30;
  int local_1c;
  int local_18;
  int mode_local;
  int speed_local;
  int channel_local;
  SPI *this_local;
  
  mode_local = (int)__file;
  local_1c = in_ECX;
  local_18 = __oflag;
  _speed_local = this;
  if (this->_fd != -1) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>(&local_30,stream);
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"SPI is already opened");
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  if ((in_ECX < 0) || (3 < in_ECX)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Wrong \'mode\' parameter to open SPI channel");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  snprintf(local_68,0x20,_spiDevTemplate,(ulong)__file & 0xffffffff);
  iVar1 = ::open(local_68,2);
  this->_fd = iVar1;
  if (iVar1 < 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    peVar4 = (error_code *)strerror(*piVar3);
    std::error_code::error_code<std::io_errc,void>(&local_78,stream);
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  iVar1 = ioctl(this->_fd,0x40016b01,&local_1c);
  if (iVar1 < 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    peVar4 = (error_code *)strerror(*piVar3);
    std::error_code::error_code<std::io_errc,void>(&local_88,stream);
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  iVar1 = ioctl(this->_fd,0x40016b03,"\b3SPI");
  if (iVar1 < 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    peVar4 = (error_code *)strerror(*piVar3);
    std::error_code::error_code<std::io_errc,void>(&local_98,stream);
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  iVar1 = ioctl(this->_fd,0x40046b04,&local_18);
  if (iVar1 < 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    peVar4 = (error_code *)strerror(*piVar3);
    std::error_code::error_code<std::io_errc,void>(&local_a8,stream);
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  return iVar1;
}

Assistant:

void SPI::open(int channel, int speed, int mode) {
    if (_fd != -1)
        throw std::ios_base::failure("SPI is already opened");
    if (mode < 0 || mode > 3)
        throw std::invalid_argument("Wrong 'mode' parameter to open SPI channel");
    char spiDev[32];
    ::snprintf(spiDev, sizeof(spiDev), _spiDevTemplate, channel);
    if ((_fd = ::open(spiDev, O_RDWR)) < 0)
        throw std::ios_base::failure(::strerror(errno));
    if (::ioctl(_fd, SPI_IOC_WR_MODE, &mode) < 0)
        throw std::ios_base::failure(::strerror(errno));

    if (::ioctl(_fd, SPI_IOC_WR_BITS_PER_WORD, &_spiBPW) < 0)
        throw std::ios_base::failure(::strerror(errno));

    if (::ioctl(_fd, SPI_IOC_WR_MAX_SPEED_HZ, &speed) < 0)
        throw std::ios_base::failure(::strerror(errno));

}